

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::~Value(Value *this)

{
  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *this_00;
  CommentInfo *pCVar1;
  char *pcVar2;
  CommentInfo *this_01;
  uint uVar3;
  Value *this_local;
  
  uVar3 = (uint)(ushort)(byte)this->field_0x8;
  if (3 < (byte)this->field_0x8) {
    if (uVar3 == 4) {
      if ((*(ushort *)&this->field_0x8 >> 8 & 1) != 0) {
        releasePrefixedStringValue((this->value_).string_);
      }
    }
    else if (uVar3 != 5) {
      if (1 < uVar3 - 6) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmjsoncpp/src/lib_json/json_value.cpp"
                      ,0x201,"Json::Value::~Value()");
      }
      this_00 = (this->value_).map_;
      if (this_00 !=
          (map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
           *)0x0) {
        std::
        map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
        ::~map(this_00);
        operator_delete(this_00,0x30);
      }
    }
  }
  pCVar1 = this->comments_;
  if (pCVar1 != (CommentInfo *)0x0) {
    pcVar2 = pCVar1[-1].comment_;
    this_01 = pCVar1 + (long)pcVar2;
    while (pCVar1 != this_01) {
      this_01 = this_01 + -1;
      CommentInfo::~CommentInfo(this_01);
    }
    operator_delete__(pCVar1 + -1,(long)pcVar2 * 8 + 8);
  }
  (this->value_).int_ = 0;
  return;
}

Assistant:

Value::~Value() {
  switch (type_) {
  case nullValue:
  case intValue:
  case uintValue:
  case realValue:
  case booleanValue:
    break;
  case stringValue:
    if (allocated_)
      releasePrefixedStringValue(value_.string_);
    break;
  case arrayValue:
  case objectValue:
    delete value_.map_;
    break;
  default:
    JSON_ASSERT_UNREACHABLE;
  }

  delete[] comments_;

  value_.uint_ = 0;
}